

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::FixedRate::deltaRule(FixedRate *this,Array *var,Array *grad)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  size_t sVar6;
  
  sVar6 = var->_M_size;
  if (deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar == '\0') {
    deltaRule();
  }
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    if (deltaRule::lastVar._M_size != sVar6) {
      operator_delete(deltaRule::lastVar._M_data);
      deltaRule::lastVar._M_size = sVar6;
      deltaRule::lastVar._M_data = (float *)operator_new(sVar6 * 4);
    }
    pfVar2 = deltaRule::lastVar._M_data;
    if (sVar6 != 0) {
      memset(deltaRule::lastVar._M_data,0,sVar6 << 2);
    }
    sVar6 = var->_M_size;
    if (deltaRule::lastVar._M_size == sVar6) {
      if (deltaRule::lastVar._M_size == 0) goto LAB_00173ec5;
      pfVar5 = var->_M_data;
    }
    else {
      if (pfVar2 != (float *)0x0) {
        operator_delete(pfVar2);
        sVar6 = var->_M_size;
      }
      deltaRule::lastVar._M_size = sVar6;
      pfVar2 = (float *)operator_new(sVar6 << 2);
      pfVar5 = var->_M_data;
      deltaRule::lastVar._M_data = pfVar2;
      if (pfVar5 == (float *)0x0) goto LAB_00173ec5;
    }
    memcpy(pfVar2,pfVar5,deltaRule::lastVar._M_size << 2);
  }
LAB_00173ec5:
  pfVar5 = grad->_M_data;
  pfVar2 = pfVar5 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar2 = (float *)0x0;
    pfVar5 = (float *)0x0;
  }
  pfVar4 = var->_M_data;
  pfVar3 = pfVar4 + var->_M_size;
  if (var->_M_size == 0) {
    pfVar3 = (float *)0x0;
    pfVar4 = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-this->learningRate,pfVar5,pfVar2,pfVar4,pfVar3);
  fVar1 = this->weightDecay;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  pfVar2 = deltaRule::lastVar._M_data + deltaRule::lastVar._M_size;
  pfVar5 = deltaRule::lastVar._M_data;
  if (deltaRule::lastVar._M_size == 0) {
    pfVar2 = (float *)0x0;
    pfVar5 = (float *)0x0;
  }
  sVar6 = var->_M_size;
  pfVar4 = var->_M_data;
  pfVar3 = pfVar4 + sVar6;
  if (sVar6 == 0) {
    pfVar4 = (float *)0x0;
  }
  if (sVar6 == 0) {
    pfVar3 = (float *)0x0;
  }
  internal::scaleAdd<float*,float*>(fVar1 * this->learningRate * -2.0,pfVar5,pfVar2,pfVar4,pfVar3);
  return;
}

Assistant:

void deltaRule(Array& var, const Array &grad) {
        size_t n = var.size();
        static Array lastVar;
        if (weightDecay != 0) {
            lastVar.resize(n);
            lastVar = var;
        }
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-learningRate,             // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
        // apply weight decay: var = var - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(lastVar), std::end(lastVar),
                std::begin(var), std::end(var));
        }
    }